

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithMapBufferFlushCase::
ModifyAfterWithMapBufferFlushCase
          (ModifyAfterWithMapBufferFlushCase *this,Context *context,char *name,char *desc,
          int bufferSizeMin,int bufferSizeMax,deUint32 usage,int flags,deUint32 glMapFlags)

{
  bool bufferUnspecifiedAfterTest;
  int bufferSizeMax_local;
  int bufferSizeMin_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ModifyAfterWithMapBufferFlushCase *this_local;
  
  bufferUnspecifiedAfterTest = isBufferUnspecifiedAfterUpload(flags,glMapFlags);
  ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ::ModifyAfterBasicCase
            (&this->
              super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
             ,context,name,desc,bufferSizeMin,bufferSizeMax,usage,bufferUnspecifiedAfterTest);
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ModifyAfterWithMapBufferFlushCase_032a8a08;
  this->m_partialUpload = (flags & 1U) != 0;
  this->m_mapFlags = glMapFlags;
  return;
}

Assistant:

ModifyAfterWithMapBufferFlushCase::ModifyAfterWithMapBufferFlushCase (Context& context, const char* name, const char* desc, int bufferSizeMin, int bufferSizeMax, deUint32 usage, int flags, deUint32 glMapFlags)
	: ModifyAfterBasicCase<MapBufferRangeFlushDurationNoAlloc>	(context, name, desc, bufferSizeMin, bufferSizeMax, usage, isBufferUnspecifiedAfterUpload(flags, glMapFlags))
	, m_partialUpload											((flags & FLAG_PARTIAL) != 0)
	, m_mapFlags												(glMapFlags)
{
}